

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::DelimitedMessageUtilTest_FailsAtEndOfStream_Test::TestBody
          (DelimitedMessageUtilTest_FailsAtEndOfStream_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer *__ptr_2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  bool clean_eof;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string full_output;
  ForeignMessage message;
  stringstream partial_stream;
  stringstream full_stream;
  AssertHelper local_3e8;
  bool local_3d9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  undefined1 local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  AssertHelper local_3a8;
  string local_3a0;
  IstreamInputStream local_380;
  stringstream local_330 [16];
  ostream local_320 [112];
  ios_base aiStack_2b0 [264];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base aiStack_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)&local_380,(Arena *)0x0);
  local_380.impl_.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)0x180000002a;
  local_380.copying_input_.input_._0_1_ = (byte)local_380.copying_input_.input_ | 3;
  local_3c8[0] = (internal)SerializeDelimitedToOstream((MessageLite *)&local_380,local_198);
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_3c8[0]) {
    testing::Message::Message((Message *)&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)local_3c8,
               (AssertionResult *)"SerializeDelimitedToOstream(message, &full_stream)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x47,local_3a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3d8._M_head_impl + 8))();
    }
  }
  if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,local_3c0);
  }
  std::__cxx11::stringbuf::str();
  local_3d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_3a0._M_string_length;
  local_3e8.data_ = (AssertHelperData *)0x2;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)local_3c8,"full_output.size()","size_t{2}",(unsigned_long *)&local_3d8,
             (unsigned_long *)&local_3e8);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_3c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&local_3d8);
  }
  else {
    if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3c0,local_3c0);
    }
    local_3d8._M_head_impl._0_4_ = 4;
    testing::internal::CmpHelperEQ<char,int>
              ((internal *)local_3c8,"full_output[0]","4",local_3a0._M_dataplus._M_p,
               (int *)&local_3d8);
    if (local_3c8[0] != (internal)0x0) {
      if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3c0,local_3c0);
      }
      local_3c8[0] = (internal)*local_3a0._M_dataplus._M_p;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_320,local_3c8,1);
      local_3c8[0] = *(internal *)(local_3a0._M_dataplus._M_p + 1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c8,1);
      local_3c8[0] = *(internal *)(local_3a0._M_dataplus._M_p + 2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&local_380);
      io::IstreamInputStream::IstreamInputStream(&local_380,(istream *)local_330,-1);
      proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)&local_3a0,(Arena *)0x0);
      local_3d9 = true;
      bVar1 = ParseDelimitedFromZeroCopyStream
                        ((MessageLite *)&local_3a0,&local_380.super_ZeroCopyInputStream,&local_3d9);
      local_3d8._M_head_impl._0_1_ = !bVar1;
      local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_3e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3c8,(internal *)&local_3d8,
                   (AssertionResult *)
                   "ParseDelimitedFromZeroCopyStream(&message, &zstream, &clean_eof)","true","false"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                   ,0x57,(char *)CONCAT71(local_3c8._1_7_,local_3c8[0]));
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3e8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_3c8._1_7_,local_3c8[0]) != &local_3b8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_3c8._1_7_,local_3c8[0]),
                          local_3b8._M_allocated_capacity + 1);
        }
        if (local_3e8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_3e8.data_ + 8))();
        }
      }
      if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3d0,local_3d0);
      }
      local_3d8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT71(local_3d8._M_head_impl._1_7_,local_3d9) ^ 1);
      local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_3d9 != false) {
        testing::Message::Message((Message *)&local_3e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3c8,(internal *)&local_3d8,(AssertionResult *)"clean_eof","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                   ,0x58,(char *)CONCAT71(local_3c8._1_7_,local_3c8[0]));
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3e8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_3c8._1_7_,local_3c8[0]) != &local_3b8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_3c8._1_7_,local_3c8[0]),
                          local_3b8._M_allocated_capacity + 1);
        }
        if (local_3e8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_3e8.data_ + 8))();
        }
      }
      if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3d0,local_3d0);
      }
      proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&local_3a0);
      io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_380.impl_);
      io::IstreamInputStream::CopyingIstreamInputStream::~CopyingIstreamInputStream
                (&local_380.copying_input_);
      goto LAB_00b6acb6;
    }
    testing::Message::Message((Message *)&local_3d8);
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_3c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&local_3d8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_3e8);
  if (local_3d8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_3d8._M_head_impl + 8))();
  }
  if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,local_3c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&local_380);
LAB_00b6acb6:
  std::__cxx11::stringstream::~stringstream(local_330);
  std::ios_base::~ios_base(aiStack_2b0);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(aiStack_128);
  return;
}

Assistant:

TEST(DelimitedMessageUtilTest, FailsAtEndOfStream) {
  std::stringstream full_stream;
  std::stringstream partial_stream;

  {
    proto2_unittest::ForeignMessage message;
    message.set_c(42);
    message.set_d(24);
    EXPECT_TRUE(SerializeDelimitedToOstream(message, &full_stream));

    std::string full_output = full_stream.str();
    ASSERT_GT(full_output.size(), size_t{2});
    ASSERT_EQ(full_output[0], 4);

    partial_stream << full_output[0] << full_output[1] << full_output[2];
  }

  {
    bool clean_eof;
    io::IstreamInputStream zstream(&partial_stream);

    proto2_unittest::ForeignMessage message;
    clean_eof = true;
    EXPECT_FALSE(ParseDelimitedFromZeroCopyStream(&message,
        &zstream, &clean_eof));
    EXPECT_FALSE(clean_eof);
  }
}